

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void resizeCharmap(Charmap **map,size_t capacity)

{
  Charmap *pCVar1;
  int *piVar2;
  char *pcVar3;
  char *local_20;
  size_t capacity_local;
  Charmap **map_local;
  
  pCVar1 = (Charmap *)realloc(*map,capacity * 0x800 + 0x18);
  *map = pCVar1;
  if (*map == (Charmap *)0x0) {
    if (*map == (Charmap *)0x0) {
      local_20 = "resize";
    }
    else {
      local_20 = "create";
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fatalerror("Failed to %s charmap: %s\n",local_20,pcVar3);
  }
  (*map)->capacity = capacity;
  return;
}

Assistant:

static void resizeCharmap(struct Charmap **map, size_t capacity)
{
	*map = (struct Charmap *)realloc(*map, sizeof(**map) + sizeof(*(*map)->nodes) * capacity);

	if (!*map)
		fatalerror("Failed to %s charmap: %s\n",
			   *map ? "create" : "resize", strerror(errno));
	(**map).capacity = capacity;
}